

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeJacobian
          (ChElementHexaCorot_8 *this,ChMatrixDynamic<> *Jacobian,ChMatrixDynamic<> *J1,
          ChVector<double> *coord)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  ActualDstType actualDst;
  ChMatrixDynamic<> J2;
  DenseStorage<double,__1,__1,__1,_1> local_78;
  Matrix<double,__1,__1,_0,__1,__1> local_58;
  assign_op<double,_double> local_39;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_38;
  
  local_78.m_data = (double *)0x0;
  local_78.m_rows = 0;
  local_78.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_78,0x18,8,3);
  lVar1 = (J1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  if ((0 < lVar1) &&
     (lVar2 = (J1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_cols, 0 < lVar2)) {
    pdVar3 = (J1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data
    ;
    *pdVar3 = (1.0 - coord->m_data[2]) * (1.0 - coord->m_data[1]) * -0.125;
    if ((((lVar2 != 1) &&
         ((((pdVar3[1] = (1.0 - coord->m_data[2]) * (1.0 - coord->m_data[1]) * 0.125, 2 < lVar2 &&
            (pdVar3[2] = (1.0 - coord->m_data[2]) * (coord->m_data[1] + 1.0) * 0.125, lVar2 != 3))
           && (pdVar3[3] = (1.0 - coord->m_data[2]) * (coord->m_data[1] + 1.0) * -0.125, 4 < lVar2))
          && ((pdVar3[4] = (coord->m_data[2] + 1.0) * (1.0 - coord->m_data[1]) * -0.125, lVar2 != 5
              && (pdVar3[5] = (coord->m_data[2] + 1.0) * (1.0 - coord->m_data[1]) * 0.125, 6 < lVar2
                 )))))) &&
        (pdVar3[6] = (coord->m_data[2] + 1.0) * (coord->m_data[1] + 1.0) * 0.125, lVar2 != 7)) &&
       (pdVar3[7] = (coord->m_data[2] + 1.0) * (coord->m_data[1] + 1.0) * -0.125, lVar1 != 1)) {
      pdVar3[lVar2] = (1.0 - coord->m_data[2]) * -(1.0 - coord->m_data[0]) * 0.125;
      pdVar3[lVar2 + 1] = (1.0 - coord->m_data[2]) * -(coord->m_data[0] + 1.0) * 0.125;
      pdVar3[lVar2 + 2] = (coord->m_data[0] + 1.0) * (1.0 - coord->m_data[2]) * 0.125;
      pdVar3[lVar2 + 3] = (1.0 - coord->m_data[0]) * (1.0 - coord->m_data[2]) * 0.125;
      pdVar3[lVar2 + 4] = (coord->m_data[2] + 1.0) * -(1.0 - coord->m_data[0]) * 0.125;
      pdVar3[lVar2 + 5] = (coord->m_data[2] + 1.0) * -(coord->m_data[0] + 1.0) * 0.125;
      pdVar3[lVar2 + 6] = (coord->m_data[0] + 1.0) * (coord->m_data[2] + 1.0) * 0.125;
      pdVar3[lVar2 + 7] = (1.0 - coord->m_data[0]) * (coord->m_data[2] + 1.0) * 0.125;
      if (2 < lVar1) {
        pdVar3[lVar2 * 2] = (1.0 - coord->m_data[1]) * -(1.0 - coord->m_data[0]) * 0.125;
        pdVar3[lVar2 * 2 + 1] = (1.0 - coord->m_data[1]) * -(coord->m_data[0] + 1.0) * 0.125;
        pdVar3[lVar2 * 2 + 2] = (coord->m_data[1] + 1.0) * -(coord->m_data[0] + 1.0) * 0.125;
        pdVar3[lVar2 * 2 + 3] = (coord->m_data[1] + 1.0) * -(1.0 - coord->m_data[0]) * 0.125;
        pdVar3[lVar2 * 2 + 4] = (1.0 - coord->m_data[0]) * (1.0 - coord->m_data[1]) * 0.125;
        pdVar3[lVar2 * 2 + 5] = (coord->m_data[0] + 1.0) * (1.0 - coord->m_data[1]) * 0.125;
        pdVar3[lVar2 * 2 + 6] = (coord->m_data[0] + 1.0) * (coord->m_data[1] + 1.0) * 0.125;
        pdVar3[lVar2 * 2 + 7] = (1.0 - coord->m_data[0]) * (coord->m_data[1] + 1.0) * 0.125;
        (**(code **)(*(long *)&((((this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_58);
        if ((0 < local_78.m_rows) && (0 < local_78.m_cols)) {
          *local_78.m_data =
               (double)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data;
          (**(code **)(*(long *)&((this->nodes).
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChNodeFEAbase + 0x60))();
          if ((1 < local_78.m_rows) && (0 < local_78.m_cols)) {
            local_78.m_data[local_78.m_cols] =
                 (double)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data;
            (**(code **)(*(long *)&((this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[2].
                                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChNodeFEAbase + 0x60))();
            if ((2 < local_78.m_rows) && (0 < local_78.m_cols)) {
              local_78.m_data[local_78.m_cols * 2] =
                   (double)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_data;
              (**(code **)(*(long *)&((this->nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->super_ChNodeFEAbase + 0x60))();
              if ((3 < local_78.m_rows) && (0 < local_78.m_cols)) {
                local_78.m_data[local_78.m_cols * 3] =
                     (double)local_58.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data;
                (**(code **)(*(long *)&((this->nodes).
                                        super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[4].
                                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                if ((4 < local_78.m_rows) && (0 < local_78.m_cols)) {
                  local_78.m_data[local_78.m_cols * 4] =
                       (double)local_58.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data;
                  (**(code **)(*(long *)&((this->nodes).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[5].
                                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                  if ((5 < local_78.m_rows) && (0 < local_78.m_cols)) {
                    local_78.m_data[local_78.m_cols * 5] =
                         (double)local_58.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                 m_storage.m_data;
                    (**(code **)(*(long *)&((this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[6].
                                            super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                    if ((6 < local_78.m_rows) && (0 < local_78.m_cols)) {
                      local_78.m_data[local_78.m_cols * 6] =
                           (double)local_58.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data;
                      (**(code **)(*(long *)&((this->nodes).
                                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[7].
                                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                      if ((7 < local_78.m_rows) && (0 < local_78.m_cols)) {
                        local_78.m_data[local_78.m_cols * 7] =
                             (double)local_58.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data;
                        (**(code **)(*(long *)&((((this->nodes).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->super_ChNodeFEAbase + 0x60))();
                        if ((0 < local_78.m_rows) && (1 < local_78.m_cols)) {
                          local_78.m_data[1] =
                               (double)local_58.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_rows;
                          (**(code **)(*(long *)&((this->nodes).
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                          if ((1 < local_78.m_rows) && (1 < local_78.m_cols)) {
                            local_78.m_data[local_78.m_cols + 1] =
                                 (double)local_58.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                         .m_storage.m_rows;
                            (**(code **)(*(long *)&((this->nodes).
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                            if ((2 < local_78.m_rows) && (1 < local_78.m_cols)) {
                              local_78.m_data[local_78.m_cols * 2 + 1] =
                                   (double)local_58.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_rows;
                              (**(code **)(*(long *)&((this->nodes).
                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                              if ((3 < local_78.m_rows) && (1 < local_78.m_cols)) {
                                local_78.m_data[local_78.m_cols * 3 + 1] =
                                     (double)local_58.
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             .m_storage.m_rows;
                                (**(code **)(*(long *)&((this->nodes).
                                                                                                                
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                if ((4 < local_78.m_rows) && (1 < local_78.m_cols)) {
                                  local_78.m_data[local_78.m_cols * 4 + 1] =
                                       (double)local_58.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_rows;
                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                  if ((5 < local_78.m_rows) && (1 < local_78.m_cols)) {
                                    local_78.m_data[local_78.m_cols * 5 + 1] =
                                         (double)local_58.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                 .m_storage.m_rows;
                                    (**(code **)(*(long *)&((this->nodes).
                                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                    if ((6 < local_78.m_rows) && (1 < local_78.m_cols)) {
                                      local_78.m_data[local_78.m_cols * 6 + 1] =
                                           (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                      (**(code **)(*(long *)&((this->nodes).
                                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                      if ((7 < local_78.m_rows) && (1 < local_78.m_cols)) {
                                        local_78.m_data[local_78.m_cols * 7 + 1] =
                                             (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows;
                                        (**(code **)(*(long *)&((((this->nodes).
                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                        if ((0 < local_78.m_rows) && (2 < local_78.m_cols)) {
                                          local_78.m_data[2] =
                                               (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                          (**(code **)(*(long *)&((this->nodes).
                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                          if ((1 < local_78.m_rows) && (2 < local_78.m_cols)) {
                                            local_78.m_data[local_78.m_cols + 2] =
                                                 (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                            (**(code **)(*(long *)&((this->nodes).
                                                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                            if ((2 < local_78.m_rows) && (2 < local_78.m_cols)) {
                                              local_78.m_data[local_78.m_cols * 2 + 2] =
                                                   (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                              (**(code **)(*(long *)&((this->nodes).
                                                                                                                                            
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                              if ((3 < local_78.m_rows) && (2 < local_78.m_cols)) {
                                                local_78.m_data[local_78.m_cols * 3 + 2] =
                                                     (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                if ((4 < local_78.m_rows) && (2 < local_78.m_cols))
                                                {
                                                  local_78.m_data[local_78.m_cols * 4 + 2] =
                                                       (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[5].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((5 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 5 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[6].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((6 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 6 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  (**(code **)(*(long *)&((this->nodes).
                                                                                                                                                    
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[7].
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->super_ChNodeFEAbase + 0x60))();
                                                  if ((7 < local_78.m_rows) && (2 < local_78.m_cols)
                                                     ) {
                                                    local_78.m_data[local_78.m_cols * 7 + 2] =
                                                         (double)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_cols;
                                                  if ((J1->
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_cols == local_78.m_rows) {
                                                    local_38.m_lhs = J1;
                                                    local_38.m_rhs = (RhsNested)&local_78;
                                                    Eigen::Matrix<double,-1,-1,0,-1,-1>::
                                                                                                        
                                                  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                                                            ((Matrix<double,_1,_1,0,_1,_1> *)
                                                             &local_58,&local_38);
                                                  Eigen::internal::
                                                  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                                                            (Jacobian,&local_58,&local_39);
                                                  if (local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data != (double *)0x0) {
                                                    free((void *)local_58.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_data[-1]);
                                                  }
                                                  if (local_78.m_data != (double *)0x0) {
                                                    free((void *)local_78.m_data[-1]);
                                                  }
                                                  return;
                                                  }
                                                  __assert_fail(
                                                  "lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                                                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",
                                                  0x62,
                                                  "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
                                                  );
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementHexaCorot_8::ComputeJacobian(ChMatrixDynamic<>& Jacobian, ChMatrixDynamic<>& J1, ChVector<> coord) {
    ChMatrixDynamic<> J2(8, 3);

    J1(0, 0) = -(1 - coord.y()) * (1 - coord.z()) / 8;
    J1(0, 1) = +(1 - coord.y()) * (1 - coord.z()) / 8;
    J1(0, 2) = +(1 + coord.y()) * (1 - coord.z()) / 8;
    J1(0, 3) = -(1 + coord.y()) * (1 - coord.z()) / 8;
    J1(0, 4) = -(1 - coord.y()) * (1 + coord.z()) / 8;
    J1(0, 5) = +(1 - coord.y()) * (1 + coord.z()) / 8;
    J1(0, 6) = +(1 + coord.y()) * (1 + coord.z()) / 8;
    J1(0, 7) = -(1 + coord.y()) * (1 + coord.z()) / 8;

    J1(1, 0) = -(1 - coord.x()) * (1 - coord.z()) / 8;
    J1(1, 1) = -(1 + coord.x()) * (1 - coord.z()) / 8;
    J1(1, 2) = +(1 + coord.x()) * (1 - coord.z()) / 8;
    J1(1, 3) = +(1 - coord.x()) * (1 - coord.z()) / 8;
    J1(1, 4) = -(1 - coord.x()) * (1 + coord.z()) / 8;
    J1(1, 5) = -(1 + coord.x()) * (1 + coord.z()) / 8;
    J1(1, 6) = +(1 + coord.x()) * (1 + coord.z()) / 8;
    J1(1, 7) = +(1 - coord.x()) * (1 + coord.z()) / 8;

    J1(2, 0) = -(1 - coord.x()) * (1 - coord.y()) / 8;
    J1(2, 1) = -(1 + coord.x()) * (1 - coord.y()) / 8;
    J1(2, 2) = -(1 + coord.x()) * (1 + coord.y()) / 8;
    J1(2, 3) = -(1 - coord.x()) * (1 + coord.y()) / 8;
    J1(2, 4) = +(1 - coord.x()) * (1 - coord.y()) / 8;
    J1(2, 5) = +(1 + coord.x()) * (1 - coord.y()) / 8;
    J1(2, 6) = +(1 + coord.x()) * (1 + coord.y()) / 8;
    J1(2, 7) = +(1 - coord.x()) * (1 + coord.y()) / 8;

    J2(0, 0) = nodes[0]->GetX0().x();
    J2(1, 0) = nodes[1]->GetX0().x();
    J2(2, 0) = nodes[2]->GetX0().x();
    J2(3, 0) = nodes[3]->GetX0().x();
    J2(4, 0) = nodes[4]->GetX0().x();
    J2(5, 0) = nodes[5]->GetX0().x();
    J2(6, 0) = nodes[6]->GetX0().x();
    J2(7, 0) = nodes[7]->GetX0().x();

    J2(0, 1) = nodes[0]->GetX0().y();
    J2(1, 1) = nodes[1]->GetX0().y();
    J2(2, 1) = nodes[2]->GetX0().y();
    J2(3, 1) = nodes[3]->GetX0().y();
    J2(4, 1) = nodes[4]->GetX0().y();
    J2(5, 1) = nodes[5]->GetX0().y();
    J2(6, 1) = nodes[6]->GetX0().y();
    J2(7, 1) = nodes[7]->GetX0().y();

    J2(0, 2) = nodes[0]->GetX0().z();
    J2(1, 2) = nodes[1]->GetX0().z();
    J2(2, 2) = nodes[2]->GetX0().z();
    J2(3, 2) = nodes[3]->GetX0().z();
    J2(4, 2) = nodes[4]->GetX0().z();
    J2(5, 2) = nodes[5]->GetX0().z();
    J2(6, 2) = nodes[6]->GetX0().z();
    J2(7, 2) = nodes[7]->GetX0().z();

    Jacobian = J1 * J2;
}